

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  ImVector<ImGuiStyleMod> *this;
  ImGuiStyleMod local_34;
  ImGuiStyleVarInfo *local_28;
  ImVec2 *pvar;
  ImGuiStyleVarInfo *var_info;
  ImVec2 *val_local;
  ImGuiStyleVar idx_local;
  
  var_info = (ImGuiStyleVarInfo *)val;
  val_local._4_4_ = idx;
  pvar = (ImVec2 *)GetStyleVarInfo(idx);
  if (((ImGuiStyleVarInfo *)pvar)->Type == ImGuiDataType_Float2) {
    local_28 = (ImGuiStyleVarInfo *)ImGuiStyleVarInfo::GetVarPtr((ImGuiStyleVarInfo *)pvar);
    this = &GImGui->StyleModifiers;
    ImGuiStyleMod::ImGuiStyleMod(&local_34,val_local._4_4_,(ImVec2)*local_28);
    ImVector<ImGuiStyleMod>::push_back(this,&local_34);
    *local_28 = *var_info;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x1274,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, const ImVec2& val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float2)
    {
        ImVec2* pvar = (ImVec2*)var_info->GetVarPtr();
        GImGui->StyleModifiers.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0); // Called function with wrong-type? Variable is not a ImVec2.
}